

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Match.cc
# Opt level: O1

uint64_t __thiscall flow::MatchRegEx::evaluate(MatchRegEx *this,FlowString *condition,Runner *env)

{
  long *plVar1;
  pointer ppVar2;
  pointer ppVar3;
  bool bVar4;
  undefined8 *puVar5;
  MatchRegEx *pMVar6;
  pointer this_00;
  Result *result;
  bool bVar7;
  
  plVar1 = (long *)env->userdata_;
  if (plVar1 == (long *)0x0) {
    result = (Result *)0x0;
  }
  else {
    if (*plVar1 == 0) {
      puVar5 = (undefined8 *)operator_new(0x20);
      *puVar5 = 0;
      puVar5[1] = 0;
      puVar5[2] = 0;
      puVar5[3] = 0;
      *plVar1 = (long)puVar5;
    }
    result = (Result *)*plVar1;
  }
  this_00 = (this->map_).
            super__Vector_base<std::pair<flow::util::RegExp,_unsigned_long>,_std::allocator<std::pair<flow::util::RegExp,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->map_).
           super__Vector_base<std::pair<flow::util::RegExp,_unsigned_long>,_std::allocator<std::pair<flow::util::RegExp,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar7 = this_00 == ppVar2;
  pMVar6 = this;
  if (!bVar7) {
    bVar4 = util::RegExp::match(&this_00->first,condition,result);
    pMVar6 = (MatchRegEx *)this_00->second;
    if (!bVar4) {
      do {
        ppVar3 = this_00;
        this_00 = ppVar3 + 1;
        bVar7 = this_00 == ppVar2;
        if (bVar7) goto LAB_0016597e;
        bVar4 = util::RegExp::match(&this_00->first,condition,result);
      } while (!bVar4);
      pMVar6 = (MatchRegEx *)ppVar3[1].second;
    }
  }
LAB_0016597e:
  if (bVar7) {
    pMVar6 = (MatchRegEx *)(this->super_Match).def_.elsePC;
  }
  return (uint64_t)pMVar6;
}

Assistant:

uint64_t MatchRegEx::evaluate(const FlowString* condition, Runner* env) const {
  util::RegExpContext* cx = reinterpret_cast<util::RegExpContext*>(env->userdata());
  util::RegExp::Result* rs = cx ? cx->regexMatch() : nullptr;
  for (const std::pair<util::RegExp, uint64_t>& one : map_) {
    if (one.first.match(*condition, rs)) {
      return one.second;
    }
  }

  return def_.elsePC;  // no match found
}